

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PotDiff.cpp
# Opt level: O0

void __thiscall OpenMD::PotDiff::writeDiff(PotDiff *this)

{
  byte bVar1;
  char *pcVar2;
  ostream *poVar3;
  size_type sVar4;
  reference pvVar5;
  undefined8 uVar6;
  long in_RDI;
  RealType RVar7;
  RealType RVar8;
  RealType RVar9;
  uint i;
  RealType m95;
  RealType sigma;
  RealType mu;
  ofstream ofs;
  Accumulator<double> *in_stack_fffffffffffffd40;
  Accumulator<double> *in_stack_fffffffffffffd50;
  uint local_234;
  ostream local_208 [520];
  
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_208,pcVar2,_S_bin);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    uVar6 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,"PotDiff: unable to open %s\n",uVar6);
    painCave.isFatal = 1;
    simError();
  }
  else {
    RVar7 = Utils::Accumulator<double>::getAverage((Accumulator<double> *)(in_RDI + 0x100));
    RVar8 = Utils::Accumulator<double>::getStdDev(in_stack_fffffffffffffd40);
    RVar9 = Utils::Accumulator<double>::get95percentConfidenceInterval(in_stack_fffffffffffffd50);
    std::operator<<(local_208,"#potDiff\n");
    poVar3 = std::operator<<(local_208,"#selection: (");
    poVar3 = std::operator<<(poVar3,(string *)(in_RDI + 0x138));
    std::operator<<(poVar3,")\n");
    poVar3 = std::operator<<(local_208,"# <diff> = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,RVar7);
    std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(local_208,"# StdDev = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,RVar8);
    std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(local_208,"# 95% confidence interval = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,RVar9);
    std::operator<<(poVar3,"\n");
    std::operator<<(local_208,"# t\tdiff[t]\n");
    for (local_234 = 0;
        sVar4 = std::vector<double,_std::allocator<double>_>::size
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xd0)),
        local_234 < sVar4; local_234 = local_234 + 1) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xe8),
                          (ulong)local_234);
      poVar3 = (ostream *)std::ostream::operator<<(local_208,*pvVar5);
      poVar3 = std::operator<<(poVar3,"\t");
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xd0),
                          (ulong)local_234);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar5);
      std::operator<<(poVar3,"\n");
    }
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_208);
  return;
}

Assistant:

void PotDiff::writeDiff() {
    std::ofstream ofs(outputFilename_.c_str(), std::ios::binary);
    if (ofs.is_open()) {
      RealType mu    = data_.getAverage();
      RealType sigma = data_.getStdDev();
      RealType m95   = data_.get95percentConfidenceInterval();

      ofs << "#potDiff\n";
      ofs << "#selection: (" << selectionScript_ << ")\n";
      ofs << "# <diff> = " << mu << "\n";
      ofs << "# StdDev = " << sigma << "\n";
      ofs << "# 95% confidence interval = " << m95 << "\n";
      ofs << "# t\tdiff[t]\n";
      for (unsigned int i = 0; i < diff_.size(); ++i) {
        ofs << times_[i] << "\t" << diff_[i] << "\n";
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "PotDiff: unable to open %s\n", outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }
    ofs.close();
  }